

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O3

bool CoreML::Specification::operator==(SupportVectorRegressor *a,SupportVectorRegressor *b)

{
  DenseSupportVectors *pDVar1;
  SparseSupportVectors *pSVar2;
  bool bVar3;
  DenseSupportVectors *pDVar4;
  SparseSupportVectors *pSVar5;
  Kernel *b_00;
  Coefficients *pCVar6;
  Kernel *a_00;
  Coefficients *pCVar7;
  
  a_00 = a->kernel_;
  if (a_00 == (Kernel *)0x0) {
    a_00 = (Kernel *)&_Kernel_default_instance_;
  }
  b_00 = b->kernel_;
  if (b_00 == (Kernel *)0x0) {
    b_00 = (Kernel *)&_Kernel_default_instance_;
  }
  bVar3 = operator==(a_00,b_00);
  if ((bVar3) && (a->_oneof_case_[0] == b->_oneof_case_[0])) {
    pCVar7 = a->coefficients_;
    if (pCVar7 == (Coefficients *)0x0) {
      pCVar7 = (Coefficients *)&_Coefficients_default_instance_;
    }
    pCVar6 = b->coefficients_;
    if (pCVar6 == (Coefficients *)0x0) {
      pCVar6 = (Coefficients *)&_Coefficients_default_instance_;
    }
    bVar3 = operator==(&pCVar7->alpha_,&pCVar6->alpha_);
    if (bVar3) {
      if (((a->rho_ == b->rho_) && (!NAN(a->rho_) && !NAN(b->rho_))) && (a->_oneof_case_[0] != 0)) {
        if (a->_oneof_case_[0] == 3) {
          pDVar1 = (a->supportVectors_).densesupportvectors_;
          if (b->_oneof_case_[0] == 3) {
            pDVar4 = (b->supportVectors_).densesupportvectors_;
          }
          else {
            pDVar4 = DenseSupportVectors::default_instance();
          }
          bVar3 = operator==(&pDVar1->vectors_,&pDVar4->vectors_);
          return bVar3;
        }
        pSVar2 = (a->supportVectors_).sparsesupportvectors_;
        if (b->_oneof_case_[0] == 2) {
          pSVar5 = (b->supportVectors_).sparsesupportvectors_;
        }
        else {
          pSVar5 = SparseSupportVectors::default_instance();
        }
        bVar3 = operator==(&pSVar2->vectors_,&pSVar5->vectors_);
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const SupportVectorRegressor& a,
                        const SupportVectorRegressor& b) {
            if (a.kernel() != b.kernel()) {
                return false;
            }
            if (a.supportVectors_case() != b.supportVectors_case()) {
                return false;
            }
            if (a.coefficients() != b.coefficients()) {
                return false;
            }
            if (a.rho() != b.rho()) {
                return false;
            }
            switch (a.supportVectors_case()) {
                case SupportVectorRegressor::kSparseSupportVectors:
                    return a.sparsesupportvectors().vectors() == b.sparsesupportvectors().vectors();
                case SupportVectorRegressor::kDenseSupportVectors:
                    return a.densesupportvectors().vectors() == b.densesupportvectors().vectors();
                case SupportVectorRegressor::SUPPORTVECTORS_NOT_SET:
                    return false;
            }
        }